

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# taylor_math.hpp
# Opt level: O0

void exp_taylor<taylor<taylor<double,1,2>,1,2>,2>
               (taylor<taylor<taylor<double,_1,_2>,_1,_2>,_1,_2> *t,
               taylor<taylor<double,_1,_2>,_1,_2> *x0)

{
  taylor<taylor<double,_1,_2>,_1,_2> *ptVar1;
  taylor<taylor<double,_1,_2>,_1,_2> local_100;
  int local_b4;
  undefined1 local_b0 [4];
  int i;
  int local_64;
  undefined1 local_60 [8];
  taylor<taylor<double,_1,_2>,_1,_2> ifac;
  taylor<taylor<double,_1,_2>,_1,_2> *x0_local;
  taylor<taylor<taylor<double,_1,_2>,_1,_2>,_1,_2> *t_local;
  
  local_64 = 1;
  ifac.super_polynomial<taylor<double,_1,_2>,_1,_2>.c[2].super_polynomial<double,_1,_2>.c[2] =
       (double)x0;
  taylor<taylor<double,_1,_2>,_1,_2>::taylor<int>
            ((taylor<taylor<double,_1,_2>,_1,_2> *)local_60,&local_64);
  exp<taylor<double,1,2>,1,2>
            ((taylor<taylor<double,_1,_2>,_1,_2> *)local_b0,
             (taylor<taylor<double,_1,_2>,_1,_2> *)
             ifac.super_polynomial<taylor<double,_1,_2>,_1,_2>.c[2].super_polynomial<double,_1,_2>.c
             [2]);
  ptVar1 = taylor<taylor<taylor<double,_1,_2>,_1,_2>,_1,_2>::operator[](t,0);
  memcpy(ptVar1,local_b0,0x48);
  for (local_b4 = 1; local_b4 < 3; local_b4 = local_b4 + 1) {
    taylor<taylor<double,_1,_2>,_1,_2>::operator*=
              ((taylor<taylor<double,_1,_2>,_1,_2> *)local_60,local_b4);
    ptVar1 = taylor<taylor<taylor<double,_1,_2>,_1,_2>,_1,_2>::operator[](t,0);
    operator/(&local_100,ptVar1,(taylor<taylor<double,_1,_2>,_1,_2> *)local_60);
    ptVar1 = taylor<taylor<taylor<double,_1,_2>,_1,_2>,_1,_2>::operator[](t,local_b4);
    memcpy(ptVar1,&local_100,0x48);
  }
  return;
}

Assistant:

static void exp_taylor(taylor<T, 1, Ndeg> & t, const T & x0) {
  T ifac(1);
  t[0] = exp(x0);
  for (int i = 1; i <= Ndeg; i++) {
    ifac *= i;
    t[i] = t[0] / ifac;
  }
}